

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.c
# Opt level: O3

void ixgbe_rx_batch_cold_3(void)

{
  uint in_ESI;
  long in_RDI;
  
  *(uint *)(*(long *)(in_RDI + 0x70) + 0x880) =
       *(uint *)(*(long *)(in_RDI + 0x70) + 0x880) & ~(1 << (in_ESI & 0x1f));
  *(int *)(*(long *)(in_RDI + 0x70) + 0x888) = 1 << (in_ESI & 0x1f);
  fprintf(_stderr,"[DEBUG] %s:%d %s(): Using polling\n",
          "/workspace/llm4binary/github/license_c_cmakelists/emmericp[P]ixy/src/driver/ixgbe.c",0x74
          ,"disable_interrupt");
  return;
}

Assistant:

static void disable_interrupt(struct ixgbe_device* dev, uint16_t queue_id) {
	// Clear interrupt mask to stop from interrupts being generated
	u32 mask = get_reg32(dev->addr, IXGBE_EIMS);
	mask &= ~(1 << queue_id);
	set_reg32(dev->addr, IXGBE_EIMS, mask);
	clear_interrupt(dev, queue_id);
	debug("Using polling");
}